

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O2

Var Js::HelperMethodWrapper16
              (ScriptContext *scriptContext,void *origHelperAddr,Var arg1,Var arg2,Var arg3,Var arg4
              ,Var arg5,Var arg6,Var arg7,Var arg8,Var arg9,Var arg10,Var arg11,Var arg12,Var arg13,
              Var arg14,Var arg15,Var arg16)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var pvVar4;
  anon_class_136_17_1acc1681 local_158;
  anon_class_136_17_1acc1681 local_d0;
  ScriptContext *local_48;
  Var local_40;
  AutoRegisterIgnoreExceptionWrapper local_38;
  
  if (origHelperAddr == (void *)0x0) {
    AssertCount = AssertCount + 1;
    local_48 = scriptContext;
    local_40 = arg4;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0xca,"(origHelperAddr)","origHelperAddr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    arg4 = local_40;
    scriptContext = local_48;
  }
  local_d0.arg5 = arg5;
  local_d0.arg6 = arg6;
  local_d0.arg7 = arg7;
  local_d0.arg8 = arg8;
  local_d0.arg9 = arg9;
  local_d0.arg10 = arg10;
  local_d0.arg11 = arg11;
  local_d0.arg12 = arg12;
  local_d0.arg13 = arg13;
  local_d0.arg14 = arg14;
  local_d0.arg15 = arg15;
  local_d0.arg16 = arg16;
  local_d0.origHelperAddr = origHelperAddr;
  local_d0.arg1 = arg1;
  local_d0.arg2 = arg2;
  local_d0.arg3 = arg3;
  local_d0.arg4 = arg4;
  bVar2 = AutoRegisterIgnoreExceptionWrapper::IsRegistered(scriptContext->threadContext);
  if (bVar2) {
    pvVar4 = HelperMethodWrapper16::anon_class_136_17_1acc1681::operator()(&local_d0);
  }
  else {
    AutoRegisterIgnoreExceptionWrapper::AutoRegisterIgnoreExceptionWrapper
              (&local_38,scriptContext->threadContext);
    memcpy(&local_158,&local_d0,0x88);
    pvVar4 = HelperMethodWrapper16::anon_class_136_17_1acc1681::operator()(&local_158);
    AutoRegisterIgnoreExceptionWrapper::~AutoRegisterIgnoreExceptionWrapper(&local_38);
  }
  return pvVar4;
}

Assistant:

Var HelperMethodWrapper16(ScriptContext* scriptContext, void* origHelperAddr, Var arg1, Var arg2, Var arg3, Var arg4, Var arg5, Var arg6, Var arg7, Var arg8, Var arg9, Var arg10, Var arg11, Var arg12, Var arg13, Var arg14, Var arg15, Var arg16)
    {
        Assert(origHelperAddr);
        return HelperMethodWrapper(scriptContext, [=] {
            return ((OrigHelperMethod16)origHelperAddr)(arg1, arg2, arg3, arg4, arg5, arg6, arg7, arg8, arg9, arg10, arg11, arg12, arg13, arg14, arg15, arg16);
        });
    }